

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O2

LispPTR rplacd(LispPTR x,LispPTR y)

{
  uint *NAddr;
  DLword *pDVar1;
  LispPTR LVar2;
  LispPTR ptr;
  uint uVar3;
  LispPTR *pLVar4;
  LispPTR *pLVar5;
  ConsCell *NAddr_00;
  conspage *pg;
  ulong uVar6;
  char *cp;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if ((*(ushort *)((ulong)(x >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
    pLVar4 = NativeAligned4FromLAddr(x);
    pDVar1 = MDStypetbl;
    LVar2 = cdr(x);
    if ((-1 < *(short *)((ulong)(pDVar1 + (LVar2 >> 9)) ^ 2)) && (*GcDisabled_word != 0x4c)) {
      LVar2 = *Reclaim_cnt_word;
      ptr = cdr(x);
      if (LVar2 == 0) {
        rec_htfind(ptr,1);
      }
      else {
        htfind(ptr,1);
      }
    }
    if ((-1 < *(short *)((ulong)(y >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if (*Reclaim_cnt_word == 0) {
        rec_htfind(y,0);
      }
      else {
        htfind(y,0);
      }
    }
    uVar3 = *pLVar4;
    if (uVar3 < 0x10000000) {
      pLVar4 = NativeAligned4FromLAddr(uVar3);
      LVar2 = uVar3 + (*pLVar4 >> 0x1c) * 2;
    }
    else {
      if ((int)uVar3 < 0) {
        if (y == 0) {
          *pLVar4 = uVar3 & 0x8fffffff;
          return x;
        }
        if (((x + 0xe < y) || (y < x || y - x == 0)) || ((x & 0xfffff00) != (y & 0xfffff00))) {
          pLVar5 = NativeAligned4FromLAddr(x & 0xfffff00);
          uVar3 = pLVar5[2];
          if (0xffffff < uVar3) {
            uVar8 = uVar3 >> 0x10 & 0xff;
            uVar6 = 0;
            while (uVar8 != 0) {
              uVar7 = (ulong)uVar8;
              uVar9 = (ulong)uVar8;
              if (uVar8 <= (x & 0xff) + 0xe && (x & 0xff) < uVar8) {
                NAddr = (uint *)((long)pLVar5 + uVar9 * 2);
                uVar8 = *(uint *)((long)pLVar5 + uVar9 * 2);
                if ((int)uVar6 == 0) {
                  LVar2 = uVar3 & 0xff00ffff | uVar8 >> 8 & 0xff0000;
                }
                else {
                  *(char *)((long)pLVar5 + uVar6 * 2 + 3) = (char)(uVar8 >> 0x18);
                  LVar2 = pLVar5[2];
                }
                pLVar5[2] = LVar2 - 0x1000000;
                *NAddr = y & 0xfffffff;
                LVar2 = LAddrFromNative(NAddr);
                *pLVar4 = *pLVar4 & 0xfffffff | (LVar2 - x & 0xfffffffe) << 0x1b;
                return x;
              }
              uVar6 = uVar7;
              uVar8 = (uint)*(byte *)((long)pLVar5 + uVar9 * 2 + 3);
            }
          }
          pLVar5 = &ListpDTD->dtd_nextpage;
          do {
            pDVar1 = Lisp_world;
            if (*pLVar5 == 0) {
              pg = next_conspage();
              NAddr_00 = find_cdrpair_in_page(pg,x,y);
              break;
            }
            uVar6 = (ulong)(*pLVar5 << 8);
            NAddr_00 = find_cdrpair_in_page((conspage *)(Lisp_world + uVar6),x,y);
            pLVar5 = (LispPTR *)(pDVar1 + uVar6 + 6);
          } while (NAddr_00 == (ConsCell *)0x0);
          *NAddr_00 = (ConsCell)((uint)*NAddr_00 & 0xf0000000 | *pLVar4 & 0xfffffff);
          LVar2 = LAddrFromNative(NAddr_00);
          uVar3 = LVar2 & 0xfffffff;
        }
        else {
          uVar3 = (y - x & 0xfffffffe) * 0x8000000 + (uVar3 & 0xfffffff) + 0x80000000;
        }
        *pLVar4 = uVar3;
        return x;
      }
      LVar2 = (uVar3 >> 0x1b & 0xe) + x;
    }
    pLVar4 = NativeAligned4FromLAddr(LVar2);
    *pLVar4 = y & 0xfffffff;
  }
  else {
    if (x == 0) {
      if (y == 0) {
        return x;
      }
      cp = "Attempt to RPLACD NIL";
    }
    else {
      cp = "ARG not List";
    }
    error(cp);
  }
  return x;
}

Assistant:

LispPTR rplacd(LispPTR x, LispPTR y)
{
  ConsCell *x_68k;
  ConsCell *temp68k;
  ConsCell *cdr_cell68k;
  LispPTR cdr_cell;
  LispPTR rp_page;
  DLword cdr_code;
  struct conspage *cons68k;

  if (Listp(x) == NIL) {
    if (x == NIL_PTR) {
      if (y != NIL_PTR)
        error("Attempt to RPLACD NIL");
      else
        return (NIL_PTR);
    } else
      error("ARG not List");
  }

  else {
    x_68k = (ConsCell *)NativeAligned4FromLAddr(x);

    GCLOOKUP(cdr(x), DELREF); /* set up reference count */
    GCLOOKUP(y, ADDREF);

    cdr_code = x_68k->cdr_code;

    if (cdr_code == CDR_INDIRECT) {
      /* cdr-indirect */

      rp_page = (LispPTR)x_68k->car_field;
      temp68k = (ConsCell *)NativeAligned4FromLAddr(rp_page);
#ifdef NEWCDRCODING
      cdr_cell = (rp_page) + (temp68k->cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(rp_page) + (temp68k->cdr_code << 1);
#endif /* NEWCDRCODING */

      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */
    } else if (cdr_code <= CDR_MAXINDIRECT) {
/* cdr-differentpage */
#ifdef NEWCDRCODING
      cdr_cell = x + (cdr_code << 1);
#else
      cdr_cell = POINTER_PAGEBASE(x) + (cdr_code << 1);
#endif /* NEWCDRCODING */
      cdr_cell68k = (ConsCell *)NativeAligned4FromLAddr(cdr_cell);
      *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code is set to 0 */

    } else if (y == NIL_PTR)
      /* cdr-samepage & y is nil */
      x_68k->cdr_code = CDR_NIL;
#ifdef NEWCDRCODING
    else if (((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y)) && (y > x) && (y <= (x + 14)))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y - x) >> 1);
#else
    else if ((rp_page = POINTER_PAGEBASE(x)) == POINTER_PAGEBASE(y))
      /* cdr-samepage & x and y are on same page */
      x_68k->cdr_code = CDR_ONPAGE + ((y & 0xff) >> 1);
#endif /* NEWCDRCODING */
    else {
      /* cdr-samepage & x and y are on different page */

      cons68k = (struct conspage *)(NativeAligned4FromLAddr(rp_page));
#ifdef NEWCDRCODING
      if ((cons68k->count > 0) && (cdr_cell68k = find_close_cell(cons68k, x))) {
        /* at least one free-cell on x's conspage */
        /* AND it's within CDR-code range of x. */

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - x) >> 1;
      }
#else
      if (cons68k->count > 0) {
        /* at least one free-cell on x's conspage */
        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->count--;
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        x_68k->cdr_code = (LAddrFromNative(cdr_cell68k) - rp_page) >> 1;
      }
#endif /* NEWCDRCODING */
      else {
/* no more free-cell on x's conspage */
#ifdef NEWCDRCODING
        temp68k = (ConsCell *)find_cdrable_pair(x, y);
        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);
        x_68k->cdr_code = CDR_INDIRECT;
#else
        cons68k = next_conspage();

        cdr_cell68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)cdr_cell68k)->next_free;
        temp68k = GetNewCell_68k(cons68k);
        cons68k->next_cell = ((freecons *)temp68k)->next_free;

        cons68k->count -= 2;

        *(LispPTR *)cdr_cell68k = y & POINTERMASK; /* cdr_code set to 0 */

        temp68k->car_field = x_68k->car_field;
        x_68k->car_field = LAddrFromNative(temp68k);

        temp68k->cdr_code = (LAddrFromNative(cdr_cell68k) & 0xff) >> 1;

        x_68k->cdr_code = CDR_INDIRECT;
#endif /* NEWCDRCODING */
      }
    }
  }